

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::protos::gen::IPCFrame::IPCFrame(IPCFrame *this)

{
  IPCFrame *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__IPCFrame_009c3750;
  this->request_id_ = 0;
  protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_BindService>::CopyablePtr
            (&this->msg_bind_service_);
  protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_BindServiceReply>::CopyablePtr
            (&this->msg_bind_service_reply_);
  protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_InvokeMethod>::CopyablePtr
            (&this->msg_invoke_method_);
  protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_InvokeMethodReply>::CopyablePtr
            (&this->msg_invoke_method_reply_);
  protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_RequestError>::CopyablePtr
            (&this->msg_request_error_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->data_for_testing_);
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<8UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

IPCFrame::IPCFrame() = default;